

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O1

void __thiscall
sf2cute::SFInstrument::RemoveZoneIf
          (SFInstrument *this,
          function<bool_(const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_&)>
          *predicate)

{
  pointer puVar1;
  SFInstrumentZone *pSVar2;
  SFInstrumentZone *pSVar3;
  char cVar4;
  long lVar5;
  iterator __first;
  pointer puVar6;
  
  puVar6 = (this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)puVar1 - (long)puVar6 >> 5;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010c2b5;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar6);
      __first._M_current = puVar6;
      if (cVar4 != '\0') goto LAB_0010c249;
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010c2b5;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar6 + 1);
      __first._M_current = puVar6 + 1;
      if (cVar4 != '\0') goto LAB_0010c249;
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010c2b5;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar6 + 2);
      __first._M_current = puVar6 + 2;
      if (cVar4 != '\0') goto LAB_0010c249;
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010c2b5;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar6 + 3);
      __first._M_current = puVar6 + 3;
      if (cVar4 != '\0') goto LAB_0010c249;
      puVar6 = puVar6 + 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)puVar1 - (long)puVar6 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      __first._M_current = puVar1;
      if (lVar5 != 3) goto LAB_0010c249;
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010c2b5;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar6);
      __first._M_current = puVar6;
      if (cVar4 != '\0') goto LAB_0010c249;
      puVar6 = puVar6 + 1;
    }
    if (*(long *)(predicate + 0x10) == 0) goto LAB_0010c2b5;
    cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar6);
    __first._M_current = puVar6;
    if (cVar4 != '\0') goto LAB_0010c249;
    puVar6 = puVar6 + 1;
  }
  if (*(long *)(predicate + 0x10) != 0) {
    cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar6);
    __first._M_current = puVar6;
    if (cVar4 == '\0') {
      __first._M_current = puVar1;
    }
LAB_0010c249:
    puVar6 = __first._M_current;
    if (__first._M_current != puVar1) {
      while (puVar6 = puVar6 + 1, puVar6 != puVar1) {
        if (*(long *)(predicate + 0x10) == 0) goto LAB_0010c2b5;
        cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar6);
        if (cVar4 == '\0') {
          pSVar2 = (puVar6->_M_t).
                   super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
                   .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
          (puVar6->_M_t).
          super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
          ._M_t.
          super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
          .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl =
               (SFInstrumentZone *)0x0;
          pSVar3 = ((__first._M_current)->_M_t).
                   super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
                   .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
          ((__first._M_current)->_M_t).
          super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
          ._M_t.
          super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
          .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl = pSVar2;
          if (pSVar3 != (SFInstrumentZone *)0x0) {
            (**(code **)((long)(pSVar3->super_SFZone)._vptr_SFZone + 8))();
          }
          __first._M_current = __first._M_current + 1;
        }
      }
    }
    std::
    vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
    ::_M_erase(&this->zones_,__first,
               (this->zones_).
               super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    return;
  }
LAB_0010c2b5:
  std::__throw_bad_function_call();
}

Assistant:

void SFInstrument::RemoveZoneIf(
    std::function<bool(const std::unique_ptr<SFInstrumentZone> &)> predicate) {
  zones_.erase(std::remove_if(zones_.begin(), zones_.end(),
    [&predicate](const std::unique_ptr<SFInstrumentZone> & zone) -> bool {
    if (predicate(zone)) {
      return true;
    }
    else {
      return false;
    }
  }), zones_.end());
}